

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipkincore_types.cpp
# Opt level: O1

ssize_t __thiscall
twitter::zipkin::thrift::Annotation::write(Annotation *this,int __fd,void *__buf,size_t __n)

{
  undefined4 in_EAX;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ssize_t sVar7;
  size_t __n_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar8;
  int iVar9;
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  apache::thrift::protocol::TProtocol::incrementOutputRecursionDepth(this_00);
  iVar1 = (*this_00->_vptr_TProtocol[4])(this_00,"Annotation");
  uVar8 = CONCAT44(iVar1,in_EAX);
  iVar1 = (*this_00->_vptr_TProtocol[6])(this_00,"timestamp",10,1,in_R8,in_R9,uVar8);
  iVar9 = (int)((ulong)uVar8 >> 0x20);
  iVar2 = (*this_00->_vptr_TProtocol[0x13])(this_00,this->timestamp);
  iVar3 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar4 = (*this_00->_vptr_TProtocol[6])(this_00,"value",0xb,2);
  iVar5 = (*this_00->_vptr_TProtocol[0x15])(this_00,&this->value);
  iVar6 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar1 = iVar4 + iVar5 + iVar6 + iVar2 + iVar3 + iVar1 + iVar9;
  if (((byte)this->__isset & 4) != 0) {
    __n_00 = 3;
    iVar2 = (*this_00->_vptr_TProtocol[6])(this_00,"host",0xc);
    sVar7 = Endpoint::write(&this->host,__fd,__buf_00,__n_00);
    iVar3 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar1 = (int)sVar7 + iVar3 + iVar2 + iVar1;
  }
  iVar2 = (*this_00->_vptr_TProtocol[8])(this_00);
  iVar3 = (*this_00->_vptr_TProtocol[5])(this_00);
  this_00->output_recursion_depth_ = this_00->output_recursion_depth_ - 1;
  return (ulong)(uint)(iVar2 + iVar1 + iVar3);
}

Assistant:

uint32_t Annotation::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("Annotation");

  xfer += oprot->writeFieldBegin("timestamp", ::apache::thrift::protocol::T_I64, 1);
  xfer += oprot->writeI64(this->timestamp);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("value", ::apache::thrift::protocol::T_STRING, 2);
  xfer += oprot->writeString(this->value);
  xfer += oprot->writeFieldEnd();

  if (this->__isset.host) {
    xfer += oprot->writeFieldBegin("host", ::apache::thrift::protocol::T_STRUCT, 3);
    xfer += this->host.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}